

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

_Bool background_thread_pause_check(tsdn_t *tsdn,background_thread_info_t *info)

{
  background_thread_state_t bVar1;
  
  bVar1 = info->state;
  if (bVar1 == background_thread_paused) {
    (info->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x40));
    malloc_mutex_lock(tsdn,&background_thread_lock);
    background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
    malloc_mutex_lock(tsdn,&info->mtx);
  }
  return bVar1 == background_thread_paused;
}

Assistant:

static bool
background_thread_pause_check(tsdn_t *tsdn, background_thread_info_t *info) {
	if (unlikely(info->state == background_thread_paused)) {
		malloc_mutex_unlock(tsdn, &info->mtx);
		/* Wait on global lock to update status. */
		malloc_mutex_lock(tsdn, &background_thread_lock);
		malloc_mutex_unlock(tsdn, &background_thread_lock);
		malloc_mutex_lock(tsdn, &info->mtx);
		return true;
	}

	return false;
}